

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O2

void __thiscall fsm_def::fsm_def(fsm_def *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_32;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (this->transitions).super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->transitions).super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->transitions).super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"node [shape = circle]",&local_31);
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->general_options,__l,&local_32);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

fsm_def()
        : general_options({"node [shape = circle]"})
    {

    }